

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O1

unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
__thiscall
gurkenlaeufer::CommonParserState::forwardToNextState
          (CommonParserState *this,string *trimmedLine,
          list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *backgroundSteps)

{
  long *plVar1;
  _List_node_base *in_RCX;
  pointer *__ptr;
  IParserStatePtr initState;
  unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  nextState;
  IParserState local_38;
  IParserState local_30;
  _List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> local_28;
  
  plVar1 = (long *)trimmedLine->_M_string_length;
  local_28._M_impl._M_node.super__List_node_base._M_next =
       (((_List_impl *)&in_RCX->_M_next)->_M_node).super__List_node_base._M_next;
  local_28._M_impl._M_node.super__List_node_base._M_prev = in_RCX->_M_prev;
  local_28._M_impl._M_node._M_size = *(size_t *)(in_RCX + 1);
  if (local_28._M_impl._M_node.super__List_node_base._M_next == in_RCX) {
    local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
    local_28._M_impl._M_node.super__List_node_base._M_prev =
         local_28._M_impl._M_node.super__List_node_base._M_next;
  }
  else {
    (local_28._M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_28
    ;
    (local_28._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_28
    ;
    in_RCX->_M_prev = in_RCX;
    in_RCX->_M_next = in_RCX;
    in_RCX[1]._M_next = (_List_node_base *)0x0;
  }
  (**(code **)(*plVar1 + 0x10))(&local_38,plVar1,&local_28);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            (&local_28);
  (**(code **)(*local_38._vptr_IParserState + 0x10))
            (&local_30,local_38._vptr_IParserState,backgroundSteps);
  if (local_30._vptr_IParserState == (_func_int **)0x0) {
    (this->super_IParserState)._vptr_IParserState = local_38._vptr_IParserState;
    local_38._vptr_IParserState = (_func_int **)0x0;
  }
  else {
    (this->super_IParserState)._vptr_IParserState = local_30._vptr_IParserState;
    local_30._vptr_IParserState = (_func_int **)0x0;
  }
  if (local_30._vptr_IParserState != (_func_int **)0x0) {
    (**(code **)(*local_30._vptr_IParserState + 8))();
  }
  if (local_38._vptr_IParserState != (_func_int **)0x0) {
    (**(code **)(*local_38._vptr_IParserState + 8))();
  }
  return (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
          )(__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IParserState> forwardToNextState(const std::string& trimmedLine, std::list<Step> backgroundSteps) const
    {
        auto initState = _factory.createInitialState(std::move(backgroundSteps));
        auto nextState = initState->parseLine(trimmedLine);
        if (nextState != nullptr) {
            return nextState;
        }
        return initState;
    }